

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O3

void amrex::WriteGenericPlotfileHeader
               (ostream *HeaderFile,int nlevels,
               Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *bArray,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix)

{
  undefined8 uVar1;
  pointer pbVar2;
  long *plVar3;
  pointer pGVar4;
  pointer pGVar5;
  pointer pGVar6;
  Vector<int,_std::allocator<int>_> *pVVar7;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar8;
  ostream *poVar9;
  pointer pbVar10;
  long lVar11;
  long lVar12;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pVVar13;
  undefined4 in_register_00000034;
  pointer pBVar14;
  ulong uVar15;
  int k;
  int iVar16;
  int n;
  int i;
  long lVar17;
  ulong uVar18;
  Box result;
  char local_c1;
  undefined1 local_c0 [24];
  double adStack_a8 [3];
  ulong local_90;
  ulong local_88;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_80;
  ulong local_78;
  Vector<int,_std::allocator<int>_> *local_70;
  Real local_68;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_60;
  Box local_58;
  
  local_90 = CONCAT44(in_register_00000034,nlevels);
  local_88 = CONCAT44(local_88._4_4_,nlevels + -1);
  *(undefined8 *)(HeaderFile + *(long *)(*(long *)HeaderFile + -0x18) + 8) = 0x11;
  local_80 = geom;
  local_70 = level_steps;
  local_68 = time;
  local_60 = bArray;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (HeaderFile,(versionName->_M_dataplus)._M_p,versionName->_M_string_length);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  poVar9 = std::ostream::_M_insert<long>((long)HeaderFile);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  pbVar10 = (varnames->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (varnames->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar10 && -1 < (long)pbVar2 - (long)pbVar10) {
    lVar17 = 8;
    lVar12 = 0;
    do {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (HeaderFile,*(char **)((long)pbVar10 + lVar17 + -8),
                          *(long *)((long)&(pbVar10->_M_dataplus)._M_p + lVar17));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      lVar12 = lVar12 + 1;
      pbVar10 = (varnames->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x20;
    } while (lVar12 < (long)(varnames->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5);
  }
  poVar9 = (ostream *)std::ostream::operator<<(HeaderFile,3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  poVar9 = std::ostream::_M_insert<double>(local_68);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  poVar9 = (ostream *)std::ostream::operator<<(HeaderFile,(int)local_88);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  pVVar13 = local_80;
  lVar12 = 0;
  do {
    poVar9 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(((pVVar13->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xlo +
                         lVar12 * 8));
    local_c0[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  uVar15 = local_90;
  lVar12 = 0;
  do {
    poVar9 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(((pVVar13->
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->prob_domain).xhi +
                         lVar12 * 8));
    local_c0[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  iVar16 = (int)uVar15;
  if (1 < iVar16) {
    uVar18 = local_88 & 0xffffffff;
    lVar12 = 0;
    do {
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (HeaderFile,
                          *(int *)((long)((ref_ratio->
                                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                          ).
                                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->vect + lVar12)
                         );
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      lVar12 = lVar12 + 0xc;
    } while (uVar18 * 0xc != lVar12);
  }
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
  pVVar13 = local_80;
  local_78 = uVar15 & 0xffffffff;
  if (iVar16 < 1) {
    local_c0[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
    pVVar13 = local_80;
  }
  else {
    lVar17 = local_78 * 200;
    lVar12 = 0;
    do {
      poVar9 = operator<<(HeaderFile,
                          (Box *)((long)&(((pVVar13->
                                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                           ).
                                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->domain).
                                         smallend + lVar12));
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      lVar12 = lVar12 + 200;
    } while (lVar17 - lVar12 != 0);
    local_c0[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
    pVVar7 = local_70;
    uVar15 = local_78;
    if (0 < iVar16) {
      uVar18 = 0;
      do {
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (HeaderFile,
                            (pVVar7->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar18]);
        local_c0[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
      if ((int)local_90 < 1) {
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (HeaderFile,
                            (((pVVar13->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).c_sys);
        local_c0[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
        std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,"0\n",2);
        return;
      }
      lVar12 = 0x20;
      uVar15 = 0;
      do {
        lVar17 = 0;
        do {
          poVar9 = std::ostream::_M_insert<double>
                             (*(double *)
                               ((long)(((pVVar13->
                                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ).
                                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                      offset + lVar17 * 8 + lVar12 + 0xfffffffffffffff8U));
          local_c0[0] = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_c0[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 200;
      } while (uVar15 != local_78);
      goto LAB_00489cfd;
    }
  }
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,local_c0,1);
LAB_00489cfd:
  poVar9 = (ostream *)
           std::ostream::operator<<
                     (HeaderFile,
                      (((pVVar13->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).c_sys);
  local_c0[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(HeaderFile,"0\n",2);
  if (0 < (int)local_90) {
    uVar15 = 0;
    do {
      poVar9 = (ostream *)std::ostream::operator<<(HeaderFile,(int)uVar15);
      local_c0[0] = ' ';
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      pVVar8 = local_60;
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      local_c0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      poVar9 = std::ostream::_M_insert<double>(local_68);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      local_88 = uVar15;
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (HeaderFile,
                          (local_70->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15]);
      local_c0[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_c0,1);
      uVar18 = local_88;
      pBVar14 = (pVVar8->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar3 = *(long **)&pBVar14[uVar15].m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>;
      lVar12 = *plVar3;
      lVar17 = plVar3[1];
      local_90 = uVar15 * 0x68;
      if (lVar17 != lVar12 && -1 < lVar17 - lVar12) {
        pGVar4 = (local_80->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar6 = pGVar4 + local_88;
        pBVar14 = pBVar14 + uVar15;
        lVar17 = 0;
        do {
          BATransformer::operator()((Box *)local_c0,&pBVar14->m_bat,(Box *)(lVar12 + lVar17 * 0x1c))
          ;
          iVar16 = (pGVar6->domain).smallend.vect[0];
          uVar1 = *(undefined8 *)((long)&pGVar4[uVar18].domain.smallend + 4);
          local_58.smallend.vect[0] = (int)CONCAT71(local_c0._1_7_,local_c0[0]);
          local_58.smallend.vect[1] = SUB74(local_c0._1_7_,3);
          local_58.bigend.vect[2] = (int)((ulong)uVar1 >> 0x20);
          local_58.bigend.vect[1] = (int)uVar1;
          local_58.smallend.vect[2] = local_c0._8_4_ - local_58.bigend.vect[2];
          local_58.bigend.vect[0] = local_c0._12_4_ - iVar16;
          local_58.smallend.vect[1] = local_58.smallend.vect[1] - local_58.bigend.vect[1];
          local_58.smallend.vect[0] = local_58.smallend.vect[0] - iVar16;
          local_58.bigend.vect[1] = local_c0._16_4_ - local_58.bigend.vect[1];
          local_58.bigend.vect[2] = local_c0._20_4_ - local_58.bigend.vect[2];
          pGVar5 = (local_80->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          RealBox::RealBox((RealBox *)local_c0,&local_58,pGVar5[uVar18].super_CoordSys.dx,
                           pGVar5[uVar18].prob_domain.xlo);
          lVar12 = 0;
          do {
            poVar9 = std::ostream::_M_insert<double>(*(double *)(local_c0 + lVar12 * 8));
            local_c1 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_c1,1);
            poVar9 = std::ostream::_M_insert<double>(adStack_a8[lVar12]);
            local_c1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_c1,1);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          lVar17 = lVar17 + 1;
          pBVar14 = (local_60->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar3 = *(long **)((long)&(pBVar14->m_ref).
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2> +
                             local_90);
          pBVar14 = (pointer)((long)&(pBVar14->m_bat).m_bat_type + local_90);
          lVar12 = *plVar3;
          lVar11 = (plVar3[1] - lVar12 >> 2) * 0x6db6db6db6db6db7;
        } while (lVar11 - lVar17 != 0 && lVar17 <= lVar11);
      }
      uVar15 = local_88;
      MultiFabHeaderPath((string *)local_c0,(int)local_88,levelPrefix,mfPrefix);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (HeaderFile,(char *)CONCAT71(local_c0._1_7_,local_c0[0]),
                          CONCAT44(local_c0._12_4_,local_c0._8_4_));
      local_58.smallend.vect[0]._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_58,1);
      if ((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_c0 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_c0._1_7_,local_c0[0]),
                        CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_78);
  }
  return;
}

Assistant:

void
WriteGenericPlotfileHeader (std::ostream &HeaderFile,
                            int nlevels,
                            const Vector<BoxArray> &bArray,
                            const Vector<std::string> &varnames,
                            const Vector<Geometry> &geom,
                            Real time,
                            const Vector<int> &level_steps,
                            const Vector<IntVect> &ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix)
{
//        BL_PROFILE("WriteGenericPlotfileHeader()");

        BL_ASSERT(nlevels <= bArray.size());
        BL_ASSERT(nlevels <= geom.size());
        BL_ASSERT(nlevels <= ref_ratio.size()+1);
        BL_ASSERT(nlevels <= level_steps.size());

        int finest_level(nlevels - 1);

        HeaderFile.precision(17);

        // ---- this is the generic plot file type name
        HeaderFile << versionName << '\n';

        HeaderFile << varnames.size() << '\n';

        for (int ivar = 0; ivar < varnames.size(); ++ivar) {
            HeaderFile << varnames[ivar] << "\n";
        }
        HeaderFile << AMREX_SPACEDIM << '\n';
        HeaderFile << time << '\n';
        HeaderFile << finest_level << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbLo(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbHi(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < finest_level; ++i) {
            HeaderFile << ref_ratio[i][0] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << geom[i].Domain() << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << level_steps[i] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            for (int k = 0; k < AMREX_SPACEDIM; ++k) {
                HeaderFile << geom[i].CellSize()[k] << ' ';
            }
            HeaderFile << '\n';
        }
        HeaderFile << (int) geom[0].Coord() << '\n';
        HeaderFile << "0\n";

        for (int level = 0; level <= finest_level; ++level) {
            HeaderFile << level << ' ' << bArray[level].size() << ' ' << time << '\n';
            HeaderFile << level_steps[level] << '\n';

            const IntVect& domain_lo = geom[level].Domain().smallEnd();
            for (int i = 0; i < bArray[level].size(); ++i)
            {
                // Need to shift because the RealBox ctor we call takes the
                // physical location of index (0,0,0).  This does not affect
                // the usual cases where the domain index starts with 0.
                const Box& b = amrex::shift(bArray[level][i], -domain_lo);
                RealBox loc = RealBox(b, geom[level].CellSize(), geom[level].ProbLo());
                for (int n = 0; n < AMREX_SPACEDIM; ++n) {
                    HeaderFile << loc.lo(n) << ' ' << loc.hi(n) << '\n';
                }
            }

            HeaderFile << MultiFabHeaderPath(level, levelPrefix, mfPrefix) << '\n';
        }
}